

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Option<Catch::TestCaseInfo>::reset(Option<Catch::TestCaseInfo> *this)

{
  TestCaseInfo *in_RDI;
  
  if (*(long *)&in_RDI->name != 0) {
    TestCaseInfo::~TestCaseInfo(in_RDI);
  }
  *(undefined8 *)&in_RDI->name = 0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }